

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O2

void Eigen::internal::
     outer_product_selector_run<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,1,1,0,1,1>const>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,1,_1,false>,2>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,1,1,0,1,1>const>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,1,_1,false>,2>::set>
               (GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_2>
                *prod,Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *dest,
               set *func,true_type *param_4)

{
  bool bVar1;
  Index IStack_d0;
  PointerType local_c0 [2];
  long local_b0;
  PointerType local_a8;
  long lStack_a0;
  long local_98;
  Nested pMStack_90;
  Index local_88;
  Index IStack_80;
  double local_78;
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,1,_1,true>>
  local_70 [64];
  
  bVar1 = true;
  IStack_d0 = 0;
  while (bVar1) {
    Block<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_true>
    ::Block((Block<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>
             *)local_70,dest,IStack_d0);
    local_c0[0] = (prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_2>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>
                  ).m_rhs.
                  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_0>
                  .m_data;
    local_78 = (prod->
               super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_2>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>
               ).m_lhs.m_matrix[IStack_d0].
               super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
               [0];
    local_b0 = (prod->
               super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_2>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>
               ).m_rhs.
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_0>
               .m_cols.m_value;
    local_a8 = (prod->
               super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_2>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>
               ).m_rhs.
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
               .m_xpr.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
               .m_data;
    lStack_a0 = ((variable_if_dynamic<long,__1> *)
                ((long)&(prod->
                        super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_2>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>
                        ).m_rhs.
                        super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
                        .m_xpr.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                + 8))->m_value;
    local_98 = ((variable_if_dynamic<long,__1> *)
               ((long)&(prod->
                       super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_2>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>
                       ).m_rhs.
                       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
                       .m_xpr.
                       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               + 0x10))->m_value;
    pMStack_90 = *(Nested *)
                  ((long)&(prod->
                          super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_2>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>
                          ).m_rhs.
                          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
                          .m_xpr.
                          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  + 0x18);
    local_88 = *(Index *)((long)&(prod->
                                 super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_2>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>
                                 ).m_rhs.
                                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
                                 .
                                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
                                 .m_xpr.
                                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                 .
                                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                         + 0x20);
    IStack_80 = (prod->
                super_ProductBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_2>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>
                ).m_rhs.
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
                .m_outerStride;
    DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,-1>,0,Eigen::Stride<0,0>>,1,-1,true>>
    ::
    lazyAssign<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,1,_1,false>const>>
              (local_70,(DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>_>
                         *)local_c0);
    bVar1 = false;
    IStack_d0 = 1;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void outer_product_selector_run(const ProductType& prod, Dest& dest, const Func& func, const true_type&) {
  typedef typename Dest::Index Index;
  // FIXME make sure rhs is sequentially stored
  // FIXME not very good if lhs is real and rhs complex while alpha is real too
  const Index rows = dest.rows();
  for (Index i=0; i<rows; ++i)
    func(dest.row(i), prod.lhs().coeff(i,0) * prod.rhs());
}